

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.cpp
# Opt level: O0

void test_qclab_qgates_SWAP<double>(void)

{
  allocator<double> *paVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  bool bVar2;
  char *pcVar3;
  reference pvVar4;
  double *pdVar5;
  char *in_R9;
  string local_1250;
  AssertHelper local_1230;
  Message local_1228;
  bool local_1219;
  undefined1 local_1218 [8];
  AssertionResult gtest_ar__21;
  SquareMatrix<double> mat3_1;
  SquareMatrix<double> check;
  SWAP<double> swap_6;
  AssertHelper local_11b8;
  Message local_11b0;
  SquareMatrix<double> local_11a8;
  SquareMatrix<double> local_1198;
  bool local_1181;
  undefined1 local_1180 [8];
  AssertionResult gtest_ar__20;
  int qnew_2 [2];
  AssertHelper local_1148;
  Message local_1140;
  SquareMatrix<double> local_1138;
  SquareMatrix<double> local_1128;
  bool local_1111;
  undefined1 local_1110 [8];
  AssertionResult gtest_ar__19;
  SquareMatrix<double> mat3;
  AssertHelper local_10d0;
  Message local_10c8;
  SquareMatrix<double> local_10c0;
  SquareMatrix<double> local_10b0;
  bool local_1099;
  undefined1 local_1098 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_1068;
  Message local_1060;
  SquareMatrix<double> local_1058;
  SquareMatrix<double> local_1048;
  SquareMatrix<double> local_1038;
  bool local_1021;
  undefined1 local_1020 [8];
  AssertionResult gtest_ar__17;
  SquareMatrix<double> mat;
  AssertHelper local_fe0;
  Message local_fd8;
  SquareMatrix<double> local_fd0;
  bool local_fb9;
  undefined1 local_fb8 [8];
  AssertionResult gtest_ar__16;
  SquareMatrix<double> mat2;
  SWAP<double> swap_5;
  AssertHelper local_f68;
  Message local_f60;
  bool local_f51;
  undefined1 local_f50 [8];
  AssertionResult gtest_ar__15;
  double local_f38 [9];
  iterator local_ef0;
  size_type local_ee8;
  undefined1 local_ee0 [8];
  V check3_1;
  V vec3_1;
  SWAP<double> swap_4;
  AssertHelper local_e80;
  Message local_e78;
  bool local_e69;
  undefined1 local_e68 [8];
  AssertionResult gtest_ar__14;
  string local_dc0;
  AssertHelper local_da0;
  Message local_d98;
  bool local_d89;
  undefined1 local_d88 [8];
  AssertionResult gtest_ar__13;
  string local_ce8;
  AssertHelper local_cc8;
  Message local_cc0;
  bool local_cb1;
  undefined1 local_cb0 [8];
  AssertionResult gtest_ar__12;
  double local_c98 [17];
  iterator local_c10;
  size_type local_c08;
  undefined1 local_c00 [8];
  V check4;
  V vec4;
  AssertHelper local_bb0;
  Message local_ba8;
  bool local_b99;
  undefined1 local_b98 [8];
  AssertionResult gtest_ar__11;
  int local_b30 [2];
  int qnew_1 [2];
  AssertHelper local_b08;
  Message local_b00;
  bool local_af1;
  undefined1 local_af0 [8];
  AssertionResult gtest_ar__10;
  double local_ad8 [8];
  iterator local_a98;
  size_type local_a90;
  undefined1 local_a88 [8];
  V check3;
  V vec3;
  AssertHelper local_a38;
  Message local_a30;
  bool local_a21;
  undefined1 local_a20 [8];
  AssertionResult gtest_ar__9;
  double local_a08 [5];
  iterator local_9e0;
  size_type local_9d8;
  undefined1 local_9d0 [8];
  V check2;
  V vec2;
  SWAP<double> swap_3;
  Message local_988;
  int local_97c;
  vector<int,_std::allocator<int>_> local_978;
  undefined1 local_960 [8];
  AssertionResult gtest_ar_14;
  Message local_948;
  int local_93c;
  vector<int,_std::allocator<int>_> local_938;
  undefined1 local_920 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_8f0;
  Message local_8e8;
  bool local_8d9;
  undefined1 local_8d8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_8a8;
  Message local_8a0;
  bool local_891;
  undefined1 local_890 [8];
  AssertionResult gtest_ar__7;
  Message local_878;
  int local_870;
  int local_86c;
  undefined1 local_868 [8];
  AssertionResult gtest_ar_12;
  SWAP<double> swap_2;
  int qubits_1 [2];
  Message local_838;
  int local_82c;
  vector<int,_std::allocator<int>_> local_828;
  undefined1 local_810 [8];
  AssertionResult gtest_ar_11;
  Message local_7f8;
  int local_7ec;
  vector<int,_std::allocator<int>_> local_7e8;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_7a0;
  Message local_798;
  bool local_789;
  undefined1 local_788 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_758;
  Message local_750;
  bool local_741;
  undefined1 local_740 [8];
  AssertionResult gtest_ar__5;
  Message local_728;
  int local_720;
  int local_71c;
  undefined1 local_718 [8];
  AssertionResult gtest_ar_9;
  SWAP<double> swap_1;
  AssertHelper local_6d8;
  Message local_6d0;
  bool local_6c1;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_690;
  Message local_688;
  bool local_679;
  undefined1 local_678 [8];
  AssertionResult gtest_ar__3;
  SWAP<double> swap2;
  AssertHelper local_638;
  Message local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  undefined1 local_608 [8];
  AssertionResult gtest_ar_8;
  Message local_5f0;
  int local_5e8;
  int local_5e4;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar_7;
  stringstream qasm;
  ostream local_5c0 [376];
  string local_448;
  AssertHelper local_428;
  Message local_420;
  SquareMatrix<double> local_418;
  bool local_401;
  undefined1 local_400 [8];
  AssertionResult gtest_ar__2;
  SquareMatrix<double> SWAP_check;
  Message local_3d8;
  int local_3cc;
  vector<int,_std::allocator<int>_> local_3c8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_6;
  Message local_398;
  int local_38c;
  vector<int,_std::allocator<int>_> local_388;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_5;
  int qnew [2];
  Message local_350;
  int local_344;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_4;
  Message local_328;
  int local_31c;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_3;
  Message local_300;
  int local_2f4;
  size_type local_2f0;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_2;
  vector<int,_std::allocator<int>_> qubits;
  Message local_2b8;
  int local_2b0;
  int local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_278;
  Message local_270;
  bool local_261;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_230;
  Message local_228;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_;
  Message local_200;
  int local_1f8;
  int local_1f4;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar;
  SWAP<double> swap;
  double local_1c8 [16];
  iterator local_148;
  size_type local_140;
  undefined1 local_138 [8];
  V v4;
  double local_118 [8];
  iterator local_d8;
  size_type local_d0;
  undefined1 local_c8 [8];
  V v3;
  double local_a8 [5];
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  V v2;
  SquareMatrix<double> I4;
  SquareMatrix<double> I3;
  undefined1 local_28 [8];
  SquareMatrix<double> I2;
  SquareMatrix<double> I1;
  
  qclab::dense::eye<double>((dense *)&I2.data_,2);
  qclab::dense::eye<double>((dense *)local_28,4);
  qclab::dense::eye<double>((dense *)&I4.data_,8);
  qclab::dense::eye<double>
            ((dense *)&v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,0x10);
  local_a8[2] = 2.0;
  local_a8[3] = 7.0;
  local_a8[0] = 3.0;
  local_a8[1] = 5.0;
  local_80 = local_a8;
  local_78 = 4;
  paVar1 = (allocator<double> *)
           ((long)&v3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  __l_08._M_len = local_78;
  __l_08._M_array = local_80;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_70,__l_08,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&v3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_118[6] = 8.0;
  local_118[7] = 3.0;
  local_118[4] = 4.0;
  local_118[5] = 1.0;
  local_118[2] = 2.0;
  local_118[3] = 7.0;
  local_118[0] = 3.0;
  local_118[1] = 5.0;
  local_d8 = local_118;
  local_d0 = 8;
  paVar1 = (allocator<double> *)
           ((long)&v4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  __l_07._M_len = local_d0;
  __l_07._M_array = local_d8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_c8,__l_07,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&v4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_1c8[0xe] = 5.0;
  local_1c8[0xf] = 1.0;
  local_1c8[0xc] = 8.0;
  local_1c8[0xd] = 9.0;
  local_1c8[10] = 5.0;
  local_1c8[0xb] = 6.0;
  local_1c8[8] = 7.0;
  local_1c8[9] = 2.0;
  local_1c8[6] = 8.0;
  local_1c8[7] = 3.0;
  local_1c8[4] = 4.0;
  local_1c8[5] = 1.0;
  local_1c8[2] = 2.0;
  local_1c8[3] = 7.0;
  local_1c8[0] = 3.0;
  local_1c8[1] = 5.0;
  local_148 = local_1c8;
  local_140 = 0x10;
  paVar1 = (allocator<double> *)((long)swap.qubits_._M_elems + 7);
  std::allocator<double>::allocator(paVar1);
  __l_06._M_len = local_140;
  __l_06._M_array = local_148;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_138,__l_06,paVar1);
  std::allocator<double>::~allocator((allocator<double> *)((long)swap.qubits_._M_elems + 7));
  qclab::qgates::SWAP<double>::SWAP((SWAP<double> *)&gtest_ar.message_);
  local_1f4 = qclab::qgates::QGate2<double>::nbQubits((QGate2<double> *)&gtest_ar.message_);
  local_1f8 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1f0,"swap.nbQubits()","2",&local_1f4,&local_1f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar2) {
    testing::Message::Message(&local_200);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x15,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_219 = qclab::qgates::SWAP<double>::fixed((SWAP<double> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_218,&local_219,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar2) {
    testing::Message::Message(&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_218,(AssertionResult *)0x693043,
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x16,pcVar3);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  bVar2 = qclab::qgates::SWAP<double>::controlled((SWAP<double> *)&gtest_ar.message_);
  local_261 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_260,&local_261,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar2) {
    testing::Message::Message(&local_270);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_260,(AssertionResult *)0x693051,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x17,pcVar3);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  local_2ac = qclab::qgates::SWAP<double>::qubit((SWAP<double> *)&gtest_ar.message_);
  local_2b0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2a8,"swap.qubit()","0",&local_2ac,&local_2b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar2) {
    testing::Message::Message(&local_2b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1a,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  qclab::qgates::SWAP<double>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,
             (SWAP<double> *)&gtest_ar.message_);
  local_2f0 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_);
  local_2f4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2e8,"qubits.size()","2",&local_2f0,&local_2f4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar2) {
    testing::Message::Message(&local_300);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,0);
  local_31c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_318,"qubits[0]","0",pvVar4,&local_31c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar2) {
    testing::Message::Message(&local_328);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,1);
  local_344 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_340,"qubits[1]","1",pvVar4,&local_344);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar2) {
    testing::Message::Message(&local_350);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qnew,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)qnew,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qnew);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x500000003;
  qclab::qgates::SWAP<double>::setQubits
            ((SWAP<double> *)&gtest_ar.message_,(int *)&gtest_ar_5.message_);
  qclab::qgates::SWAP<double>::qubits(&local_388,(SWAP<double> *)&gtest_ar.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_388,0);
  local_38c = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_370,"swap.qubits()[0]","3",pvVar4,&local_38c);
  std::vector<int,_std::allocator<int>_>::~vector(&local_388);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar2) {
    testing::Message::Message(&local_398);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  qclab::qgates::SWAP<double>::qubits(&local_3c8,(SWAP<double> *)&gtest_ar.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3c8,1);
  local_3cc = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_3b0,"swap.qubits()[1]","5",pvVar4,&local_3cc);
  std::vector<int,_std::allocator<int>_>::~vector(&local_3c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar2) {
    testing::Message::Message(&local_3d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&SWAP_check.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x24,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&SWAP_check.data_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&SWAP_check.data_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x100000000;
  qclab::qgates::SWAP<double>::setQubits
            ((SWAP<double> *)&gtest_ar.message_,(int *)&gtest_ar_5.message_);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__2.message_,1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,1.0,
             0.0,0.0,0.0,0.0,0.0,1.0);
  qclab::qgates::SWAP<double>::matrix((SWAP<double> *)&local_418);
  local_401 = qclab::dense::SquareMatrix<double>::operator==
                        (&local_418,(SquareMatrix<double> *)&gtest_ar__2.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_400,&local_401,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_418);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar2) {
    testing::Message::Message(&local_420);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_448,(internal *)local_400,(AssertionResult *)"swap.matrix() == SWAP_check",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_428,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_428,&local_420);
    testing::internal::AssertHelper::~AssertHelper(&local_428);
    std::__cxx11::string::~string((string *)&local_448);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  qclab::qgates::QGate2<double>::print((QGate2<double> *)&gtest_ar.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_7.message_);
  local_5e4 = qclab::qgates::SWAP<double>::toQASM((SWAP<double> *)&gtest_ar.message_,local_5c0,0);
  local_5e8 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_5e0,"swap.toQASM( qasm )","0",&local_5e4,&local_5e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
  if (!bVar2) {
    testing::Message::Message(&local_5f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x35,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_5f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_5f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[18],_nullptr>
            ((EqHelper *)local_608,"qasm.str()","\"swap q[0], q[1];\\n\"",&local_628,
             (char (*) [18])0x6930df);
  std::__cxx11::string::~string((string *)&local_628);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
  if (!bVar2) {
    testing::Message::Message(&local_630);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_608);
    testing::internal::AssertHelper::AssertHelper
              (&local_638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x36,pcVar3);
    testing::internal::AssertHelper::operator=(&local_638,&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_638);
    testing::Message::~Message(&local_630);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_608);
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)&std::cout,(string *)&swap2.qubits_);
  std::__cxx11::string::~string((string *)&swap2.qubits_);
  qclab::qgates::SWAP<double>::SWAP((SWAP<double> *)&gtest_ar__3.message_,2,4);
  local_679 = qclab::QObject<double>::operator==
                        ((QObject<double> *)&gtest_ar.message_,
                         (QObject<double> *)&gtest_ar__3.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_678,&local_679,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar2) {
    testing::Message::Message(&local_688);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_678,
               (AssertionResult *)"swap == swap2","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_690,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_690,&local_688);
    testing::internal::AssertHelper::~AssertHelper(&local_690);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_688);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  bVar2 = qclab::QObject<double>::operator!=
                    ((QObject<double> *)&gtest_ar.message_,(QObject<double> *)&gtest_ar__3.message_)
  ;
  local_6c1 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6c0,&local_6c1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c0);
  if (!bVar2) {
    testing::Message::Message(&local_6d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&swap_1.qubits_,(internal *)local_6c0,(AssertionResult *)"swap != swap2",
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6d8,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper(&local_6d8);
    std::__cxx11::string::~string((string *)&swap_1.qubits_);
    testing::Message::~Message(&local_6d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
  qclab::qgates::SWAP<double>::~SWAP((SWAP<double> *)&gtest_ar__3.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_7.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__2.message_);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_);
  qclab::qgates::SWAP<double>::~SWAP((SWAP<double> *)&gtest_ar.message_);
  qclab::qgates::SWAP<double>::SWAP((SWAP<double> *)&gtest_ar_9.message_,3,5);
  local_71c = qclab::qgates::QGate2<double>::nbQubits((QGate2<double> *)&gtest_ar_9.message_);
  local_720 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_718,"swap.nbQubits()","2",&local_71c,&local_720);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar2) {
    testing::Message::Message(&local_728);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_718);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x42,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_728);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  local_741 = qclab::qgates::SWAP<double>::fixed((SWAP<double> *)&gtest_ar_9.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_740,&local_741,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_740);
  if (!bVar2) {
    testing::Message::Message(&local_750);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_740,(AssertionResult *)0x693043,
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_758,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x43,pcVar3);
    testing::internal::AssertHelper::operator=(&local_758,&local_750);
    testing::internal::AssertHelper::~AssertHelper(&local_758);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_750);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
  bVar2 = qclab::qgates::SWAP<double>::controlled((SWAP<double> *)&gtest_ar_9.message_);
  local_789 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_788,&local_789,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_788);
  if (!bVar2) {
    testing::Message::Message(&local_798);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_10.message_,(internal *)local_788,(AssertionResult *)0x693051,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x44,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7a0,&local_798);
    testing::internal::AssertHelper::~AssertHelper(&local_7a0);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_788);
  qclab::qgates::SWAP<double>::qubits(&local_7e8,(SWAP<double> *)&gtest_ar_9.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_7e8,0);
  local_7ec = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_7d0,"swap.qubits()[0]","3",pvVar4,&local_7ec);
  std::vector<int,_std::allocator<int>_>::~vector(&local_7e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
  if (!bVar2) {
    testing::Message::Message(&local_7f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_7f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
  qclab::qgates::SWAP<double>::qubits(&local_828,(SWAP<double> *)&gtest_ar_9.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_828,1);
  local_82c = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_810,"swap.qubits()[1]","5",pvVar4,&local_82c);
  std::vector<int,_std::allocator<int>_>::~vector(&local_828);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_810);
  if (!bVar2) {
    testing::Message::Message(&local_838);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_810);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qubits_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x46,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)qubits_1,&local_838);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qubits_1);
    testing::Message::~Message(&local_838);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_810);
  qclab::qgates::SWAP<double>::~SWAP((SWAP<double> *)&gtest_ar_9.message_);
  swap_2.qubits_._M_elems[0] = 3;
  swap_2.qubits_._M_elems[1] = 5;
  qclab::qgates::SWAP<double>::SWAP((SWAP<double> *)&gtest_ar_12.message_,swap_2.qubits_._M_elems);
  local_86c = qclab::qgates::QGate2<double>::nbQubits((QGate2<double> *)&gtest_ar_12.message_);
  local_870 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_868,"swap.nbQubits()","2",&local_86c,&local_870);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
  if (!bVar2) {
    testing::Message::Message(&local_878);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_868);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7.message_,&local_878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
  local_891 = qclab::qgates::SWAP<double>::fixed((SWAP<double> *)&gtest_ar_12.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_890,&local_891,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_890);
  if (!bVar2) {
    testing::Message::Message(&local_8a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_890,(AssertionResult *)0x693043,
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x4e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8a8,&local_8a0);
    testing::internal::AssertHelper::~AssertHelper(&local_8a8);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_8a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_890);
  bVar2 = qclab::qgates::SWAP<double>::controlled((SWAP<double> *)&gtest_ar_12.message_);
  local_8d9 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8d8,&local_8d9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d8);
  if (!bVar2) {
    testing::Message::Message(&local_8e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_13.message_,(internal *)local_8d8,(AssertionResult *)0x693051,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x4f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8f0,&local_8e8);
    testing::internal::AssertHelper::~AssertHelper(&local_8f0);
    std::__cxx11::string::~string((string *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_8e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d8);
  qclab::qgates::SWAP<double>::qubits(&local_938,(SWAP<double> *)&gtest_ar_12.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_938,0);
  local_93c = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_920,"swap.qubits()[0]","3",pvVar4,&local_93c);
  std::vector<int,_std::allocator<int>_>::~vector(&local_938);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_920);
  if (!bVar2) {
    testing::Message::Message(&local_948);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_920);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x50,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_948);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_920);
  qclab::qgates::SWAP<double>::qubits(&local_978,(SWAP<double> *)&gtest_ar_12.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_978,1);
  local_97c = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_960,"swap.qubits()[1]","5",pvVar4,&local_97c);
  std::vector<int,_std::allocator<int>_>::~vector(&local_978);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_960);
  if (!bVar2) {
    testing::Message::Message(&local_988);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_960);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&swap_3.qubits_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x51,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&swap_3.qubits_,&local_988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&swap_3.qubits_);
    testing::Message::~Message(&local_988);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_960);
  qclab::qgates::SWAP<double>::~SWAP((SWAP<double> *)&gtest_ar_12.message_);
  qclab::qgates::SWAP<double>::SWAP
            ((SWAP<double> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_70);
  qclab::qgates::SWAP<double>::apply
            ((SWAP<double> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,NoTrans,2,
             (vector<double,_std::allocator<double>_> *)
             &check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_a08[2] = 5.0;
  local_a08[3] = 7.0;
  local_a08[0] = 3.0;
  local_a08[1] = 2.0;
  local_9e0 = local_a08;
  local_9d8 = 4;
  paVar1 = (allocator<double> *)
           ((long)&gtest_ar__9.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<double>::allocator(paVar1);
  __l_05._M_len = local_9d8;
  __l_05._M_array = local_9e0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_9d0,__l_05,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&gtest_ar__9.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_a21 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_9d0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a20,&local_a21,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a20);
  if (!bVar2) {
    testing::Message::Message(&local_a30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_a20,
               (AssertionResult *)"vec2 == check2","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x5b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a38,&local_a30);
    testing::internal::AssertHelper::~AssertHelper(&local_a38);
    std::__cxx11::string::~string
              ((string *)
               &vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_a30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a20);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_c8);
  qclab::qgates::SWAP<double>::apply
            ((SWAP<double> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<double,_std::allocator<double>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_ad8[6] = 8.0;
  local_ad8[7] = 3.0;
  local_ad8[4] = 2.0;
  local_ad8[5] = 7.0;
  local_ad8[2] = 4.0;
  local_ad8[3] = 1.0;
  local_ad8[0] = 3.0;
  local_ad8[1] = 5.0;
  local_a98 = local_ad8;
  local_a90 = 8;
  paVar1 = (allocator<double> *)
           ((long)&gtest_ar__10.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<double>::allocator(paVar1);
  __l_04._M_len = local_a90;
  __l_04._M_array = local_a98;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_a88,__l_04,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&gtest_ar__10.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_af1 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_a88);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_af0,&local_af1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_af0);
  if (!bVar2) {
    testing::Message::Message(&local_b00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)qnew_1,(internal *)local_af0,(AssertionResult *)"vec3 == check3","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x67,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b08,&local_b00);
    testing::internal::AssertHelper::~AssertHelper(&local_b08);
    std::__cxx11::string::~string((string *)qnew_1);
    testing::Message::~Message(&local_b00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_af0);
  local_b30[0] = 1;
  local_b30[1] = 2;
  qclab::qgates::SWAP<double>::setQubits
            ((SWAP<double> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_b30);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_c8);
  qclab::qgates::SWAP<double>::apply
            ((SWAP<double> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<double,_std::allocator<double>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__11.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4008000000000000;
  __l_03._M_len = 8;
  __l_03._M_array = (iterator)&gtest_ar__11.message_;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_a88,__l_03);
  local_b99 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_a88);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b98,&local_b99,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b98);
  if (!bVar2) {
    testing::Message::Message(&local_ba8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_b98,
               (AssertionResult *)"vec3 == check3","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=(&local_bb0,&local_ba8);
    testing::internal::AssertHelper::~AssertHelper(&local_bb0);
    std::__cxx11::string::~string
              ((string *)
               &vec4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b98);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &check4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_138);
  qclab::qgates::SWAP<double>::apply
            ((SWAP<double> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,NoTrans,4,
             (vector<double,_std::allocator<double>_> *)
             &check4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_c98[0xe] = 5.0;
  local_c98[0xf] = 1.0;
  local_c98[0xc] = 5.0;
  local_c98[0xd] = 6.0;
  local_c98[10] = 8.0;
  local_c98[0xb] = 9.0;
  local_c98[8] = 7.0;
  local_c98[9] = 2.0;
  local_c98[6] = 8.0;
  local_c98[7] = 3.0;
  local_c98[4] = 2.0;
  local_c98[5] = 7.0;
  local_c98[2] = 4.0;
  local_c98[3] = 1.0;
  local_c98[0] = 3.0;
  local_c98[1] = 5.0;
  local_c10 = local_c98;
  local_c08 = 0x10;
  paVar1 = (allocator<double> *)
           ((long)&gtest_ar__12.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<double>::allocator(paVar1);
  __l_02._M_len = local_c08;
  __l_02._M_array = local_c10;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_c00,__l_02,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&gtest_ar__12.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_cb1 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_c00);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cb0,&local_cb1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb0);
  if (!bVar2) {
    testing::Message::Message(&local_cc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_ce8,(internal *)local_cb0,(AssertionResult *)"vec4 == check4","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=(&local_cc8,&local_cc0);
    testing::internal::AssertHelper::~AssertHelper(&local_cc8);
    std::__cxx11::string::~string((string *)&local_ce8);
    testing::Message::~Message(&local_cc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb0);
  local_b30[0] = 0;
  local_b30[1] = 1;
  qclab::qgates::SWAP<double>::setQubits
            ((SWAP<double> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_b30);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &check4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_138);
  qclab::qgates::SWAP<double>::apply
            ((SWAP<double> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,NoTrans,4,
             (vector<double,_std::allocator<double>_> *)
             &check4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__13.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4008000000000000;
  __l_01._M_len = 0x10;
  __l_01._M_array = (iterator)&gtest_ar__13.message_;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_c00,__l_01);
  local_d89 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_c00);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d88,&local_d89,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d88);
  if (!bVar2) {
    testing::Message::Message(&local_d98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_dc0,(internal *)local_d88,(AssertionResult *)"vec4 == check4","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_da0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_da0,&local_d98);
    testing::internal::AssertHelper::~AssertHelper(&local_da0);
    std::__cxx11::string::~string((string *)&local_dc0);
    testing::Message::~Message(&local_d98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d88);
  local_b30[0] = 2;
  local_b30[1] = 3;
  qclab::qgates::SWAP<double>::setQubits
            ((SWAP<double> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_b30);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             &check4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_138);
  qclab::qgates::SWAP<double>::apply
            ((SWAP<double> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,NoTrans,4,
             (vector<double,_std::allocator<double>_> *)
             &check4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__14.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4008000000000000;
  __l_00._M_len = 0x10;
  __l_00._M_array = (iterator)&gtest_ar__14.message_;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_c00,__l_00);
  local_e69 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_c00);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e68,&local_e69,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e68);
  if (!bVar2) {
    testing::Message::Message(&local_e78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&swap_4.qubits_,(internal *)local_e68,(AssertionResult *)"vec4 == check4",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e80,&local_e78);
    testing::internal::AssertHelper::~AssertHelper(&local_e80);
    std::__cxx11::string::~string((string *)&swap_4.qubits_);
    testing::Message::~Message(&local_e78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e68);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_c00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &check4.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_a88);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_9d0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::SWAP<double>::~SWAP
            ((SWAP<double> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::SWAP<double>::SWAP
            ((SWAP<double> *)
             &vec3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,2);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &check3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_c8);
  qclab::qgates::SWAP<double>::apply
            ((SWAP<double> *)
             &vec3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<double,_std::allocator<double>_> *)
             &check3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_f38[6] = 7.0;
  local_f38[7] = 3.0;
  local_f38[4] = 5.0;
  local_f38[5] = 1.0;
  local_f38[2] = 2.0;
  local_f38[3] = 8.0;
  local_f38[0] = 3.0;
  local_f38[1] = 4.0;
  local_ef0 = local_f38;
  local_ee8 = 8;
  paVar1 = (allocator<double> *)
           ((long)&gtest_ar__15.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<double>::allocator(paVar1);
  __l._M_len = local_ee8;
  __l._M_array = local_ef0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_ee0,__l,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&gtest_ar__15.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_f51 = std::operator==((vector<double,_std::allocator<double>_> *)
                              &check3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<double,_std::allocator<double>_> *)local_ee0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f50,&local_f51,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f50);
  if (!bVar2) {
    testing::Message::Message(&local_f60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&swap_5.qubits_,(internal *)local_f50,(AssertionResult *)"vec3 == check3",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xac,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f68,&local_f60);
    testing::internal::AssertHelper::~AssertHelper(&local_f68);
    std::__cxx11::string::~string((string *)&swap_5.qubits_);
    testing::Message::~Message(&local_f60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f50);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_ee0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &check3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::SWAP<double>::~SWAP
            ((SWAP<double> *)
             &vec3_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::SWAP<double>::SWAP((SWAP<double> *)&mat2.data_,0,1);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__16.message_,(SquareMatrix<double> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<double>::apply
            ((SWAP<double> *)&mat2.data_,Left,NoTrans,2,
             (SquareMatrix<double> *)&gtest_ar__16.message_,0);
  qclab::qgates::SWAP<double>::matrix((SWAP<double> *)&local_fd0);
  local_fb9 = qclab::dense::SquareMatrix<double>::operator==
                        ((SquareMatrix<double> *)&gtest_ar__16.message_,&local_fd0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fb8,&local_fb9,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_fd0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fb8);
  if (!bVar2) {
    testing::Message::Message(&local_fd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat.data_,(internal *)local_fb8,(AssertionResult *)"mat2 == swap.matrix()"
               ,"false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fe0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xbb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_fe0,&local_fd8);
    testing::internal::AssertHelper::~AssertHelper(&local_fe0);
    std::__cxx11::string::~string((string *)&mat.data_);
    testing::Message::~Message(&local_fd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fb8);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__17.message_,1.0,2.0,3.0,4.0,5.0,6.0,7.0,8.0,9.0,10.0
             ,11.0,12.0,13.0,14.0,15.0,16.0);
  qclab::dense::SquareMatrix<double>::operator=
            ((SquareMatrix<double> *)&gtest_ar__16.message_,
             (SquareMatrix<double> *)&gtest_ar__17.message_);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<double>::apply
            ((SWAP<double> *)&mat2.data_,Left,NoTrans,2,
             (SquareMatrix<double> *)&gtest_ar__16.message_,0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            (&local_1048,(SquareMatrix<double> *)&gtest_ar__17.message_);
  qclab::qgates::SWAP<double>::matrix((SWAP<double> *)&local_1058);
  qclab::dense::operator*((dense *)&local_1038,&local_1048,&local_1058);
  local_1021 = qclab::dense::SquareMatrix<double>::operator==
                         ((SquareMatrix<double> *)&gtest_ar__16.message_,&local_1038);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1020,&local_1021,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_1038);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_1058);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_1048);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1020);
  if (!bVar2) {
    testing::Message::Message(&local_1060);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_1020,
               (AssertionResult *)"mat2 == mat * swap.matrix()","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1068,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xc4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1068,&local_1060);
    testing::internal::AssertHelper::~AssertHelper(&local_1068);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_1060);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1020);
  qclab::dense::SquareMatrix<double>::operator=
            ((SquareMatrix<double> *)&gtest_ar__16.message_,
             (SquareMatrix<double> *)&gtest_ar__17.message_);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<double>::apply
            ((SWAP<double> *)&mat2.data_,Right,NoTrans,2,
             (SquareMatrix<double> *)&gtest_ar__16.message_,0);
  qclab::qgates::SWAP<double>::matrix((SWAP<double> *)&local_10c0);
  qclab::dense::operator*
            ((dense *)&local_10b0,&local_10c0,(SquareMatrix<double> *)&gtest_ar__17.message_);
  local_1099 = qclab::dense::SquareMatrix<double>::operator==
                         ((SquareMatrix<double> *)&gtest_ar__16.message_,&local_10b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1098,&local_1099,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_10b0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_10c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1098);
  if (!bVar2) {
    testing::Message::Message(&local_10c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3.data_,(internal *)local_1098,
               (AssertionResult *)"mat2 == swap.matrix() * mat","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_10d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,200,pcVar3);
    testing::internal::AssertHelper::operator=(&local_10d0,&local_10c8);
    testing::internal::AssertHelper::~AssertHelper(&local_10d0);
    std::__cxx11::string::~string((string *)&mat3.data_);
    testing::Message::~Message(&local_10c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1098);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__19.message_,(SquareMatrix<double> *)&I4.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<double>::apply
            ((SWAP<double> *)&mat2.data_,Left,NoTrans,3,
             (SquareMatrix<double> *)&gtest_ar__19.message_,0);
  qclab::qgates::SWAP<double>::matrix((SWAP<double> *)&local_1138);
  qclab::dense::kron<double>((dense *)&local_1128,&local_1138,(SquareMatrix<double> *)&I2.data_);
  local_1111 = qclab::dense::SquareMatrix<double>::operator==
                         ((SquareMatrix<double> *)&gtest_ar__19.message_,&local_1128);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1110,&local_1111,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_1128);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_1138);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1110);
  if (!bVar2) {
    testing::Message::Message(&local_1140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)qnew_2,(internal *)local_1110,
               (AssertionResult *)"mat3 == qclab::dense::kron( swap.matrix() , I1 )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xcd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1148,&local_1140);
    testing::internal::AssertHelper::~AssertHelper(&local_1148);
    std::__cxx11::string::~string((string *)qnew_2);
    testing::Message::~Message(&local_1140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1110);
  gtest_ar__20.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x200000001;
  qclab::qgates::SWAP<double>::setQubits((SWAP<double> *)&mat2.data_,(int *)&gtest_ar__20.message_);
  qclab::dense::SquareMatrix<double>::operator=
            ((SquareMatrix<double> *)&gtest_ar__19.message_,(SquareMatrix<double> *)&I4.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<double>::apply
            ((SWAP<double> *)&mat2.data_,Left,NoTrans,3,
             (SquareMatrix<double> *)&gtest_ar__19.message_,0);
  qclab::qgates::SWAP<double>::matrix((SWAP<double> *)&local_11a8);
  qclab::dense::kron<double>((dense *)&local_1198,(SquareMatrix<double> *)&I2.data_,&local_11a8);
  local_1181 = qclab::dense::SquareMatrix<double>::operator==
                         ((SquareMatrix<double> *)&gtest_ar__19.message_,&local_1198);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1180,&local_1181,(type *)0x0);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_1198);
  qclab::dense::SquareMatrix<double>::~SquareMatrix(&local_11a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1180);
  if (!bVar2) {
    testing::Message::Message(&local_11b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&swap_6.qubits_,(internal *)local_1180,
               (AssertionResult *)"mat3 == qclab::dense::kron( I1 , swap.matrix() )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_11b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xd3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_11b8,&local_11b0);
    testing::internal::AssertHelper::~AssertHelper(&local_11b8);
    std::__cxx11::string::~string((string *)&swap_6.qubits_);
    testing::Message::~Message(&local_11b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1180);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__19.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__17.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__16.message_);
  qclab::qgates::SWAP<double>::~SWAP((SWAP<double> *)&mat2.data_);
  qclab::qgates::SWAP<double>::SWAP((SWAP<double> *)&check.data_,0,2);
  qclab::dense::zeros<double>((dense *)&mat3_1.data_,8);
  pdVar5 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)&mat3_1.data_,0,0)
  ;
  *pdVar5 = 1.0;
  pdVar5 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)&mat3_1.data_,4,1)
  ;
  *pdVar5 = 1.0;
  pdVar5 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)&mat3_1.data_,2,2)
  ;
  *pdVar5 = 1.0;
  pdVar5 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)&mat3_1.data_,6,3)
  ;
  *pdVar5 = 1.0;
  pdVar5 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)&mat3_1.data_,1,4)
  ;
  *pdVar5 = 1.0;
  pdVar5 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)&mat3_1.data_,5,5)
  ;
  *pdVar5 = 1.0;
  pdVar5 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)&mat3_1.data_,3,6)
  ;
  *pdVar5 = 1.0;
  pdVar5 = qclab::dense::SquareMatrix<double>::operator()((SquareMatrix<double> *)&mat3_1.data_,7,7)
  ;
  *pdVar5 = 1.0;
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&gtest_ar__21.message_,(SquareMatrix<double> *)&I4.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<double>::apply
            ((SWAP<double> *)&check.data_,Left,NoTrans,3,
             (SquareMatrix<double> *)&gtest_ar__21.message_,0);
  local_1219 = qclab::dense::SquareMatrix<double>::operator==
                         ((SquareMatrix<double> *)&gtest_ar__21.message_,
                          (SquareMatrix<double> *)&mat3_1.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1218,&local_1219,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1218);
  if (!bVar2) {
    testing::Message::Message(&local_1228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1250,(internal *)local_1218,(AssertionResult *)"mat3 == check","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xe6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1230,&local_1228);
    testing::internal::AssertHelper::~AssertHelper(&local_1230);
    std::__cxx11::string::~string((string *)&local_1250);
    testing::Message::~Message(&local_1228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1218);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&gtest_ar__21.message_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&mat3_1.data_);
  qclab::qgates::SWAP<double>::~SWAP((SWAP<double> *)&check.data_);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_138);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_c8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_70);
  qclab::dense::SquareMatrix<double>::~SquareMatrix
            ((SquareMatrix<double> *)
             &v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&I4.data_);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)local_28);
  qclab::dense::SquareMatrix<double>::~SquareMatrix((SquareMatrix<double> *)&I2.data_);
  return;
}

Assistant:

void test_qclab_qgates_SWAP() {

  const auto I1 = qclab::dense::eye< T >(  2 ) ;
  const auto I2 = qclab::dense::eye< T >(  4 ) ;
  const auto I3 = qclab::dense::eye< T >(  8 ) ;
  const auto I4 = qclab::dense::eye< T >( 16 ) ;

  using V = std::vector< T > ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;
  const V v4 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 , 7 , 2 , 5 , 6 , 8 , 9 , 5 , 1};

  {
    qclab::qgates::SWAP< T >  swap ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled

    // qubit
    EXPECT_EQ( swap.qubit() , 0 ) ;

    // qubits
    auto qubits = swap.qubits() ;
    EXPECT_EQ( qubits.size() , 2 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;
    EXPECT_EQ( qubits[1] , 1 ) ;
    int qnew[] = { 3 , 5 } ;
    swap.setQubits( &qnew[0] ) ;
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;
    qnew[0] = 0 ;
    qnew[1] = 1 ;
    swap.setQubits( &qnew[0] ) ;

    // matrix
    qclab::dense::SquareMatrix< T >  SWAP_check( 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( swap.matrix() == SWAP_check ) ;

    // print
    swap.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( swap.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "swap q[0], q[1];\n" ) ;
    std::cout << qasm.str() ;

    // operators == and !=
    qclab::qgates::SWAP< T >  swap2( 2 , 4 ) ;
    EXPECT_TRUE(  swap == swap2 ) ;
    EXPECT_FALSE( swap != swap2 ) ;
  }

  {
    qclab::qgates::SWAP< T >  swap( 3 , 5 ) ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    int qubits[] = { 3 , 5 } ;
    qclab::qgates::SWAP< T >  swap( &qubits[0] ) ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 1 ) ;

    // apply (2 qubits)
    auto vec2 = v2 ;
    swap.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 3 , 2 , 5 , 7 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { swap.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // apply (3 qubits)
    auto vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 5 , 4 , 1 , 2 , 7 , 8 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    int qnew[] = { 1 , 2 } ;
    swap.setQubits( &qnew[0] ) ;
    vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 3 , 2 , 5 , 7 , 4 , 8 , 1 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    // apply (4 qubits)
    auto vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    V check4 = { 3 , 5 , 4 , 1 , 2 , 7 , 8 , 3 , 7 , 2 , 8 , 9 , 5 , 6 , 5 , 1};
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ; T* vec4_ = vec4.data() ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif

    qnew[0] = 0 ;
    qnew[1] = 1 ;
    swap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , 7 , 2 , 5 , 6 , 4 , 1 , 8 , 3 , 8 , 9 , 5 , 1 } ;
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif

    qnew[0] = 2 ;
    qnew[1] = 3 ;
    swap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 2 , 5 , 7 , 4 , 8 , 1 , 3 , 7 , 5 , 2 , 6 , 8 , 5 , 9 , 1 } ;
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 2 ) ;

    // apply (3 qubits)
    auto vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 4 , 2 , 8 , 5 , 1 , 7 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 1 ) ;

    // apply (2 qubits)
    auto mat2 = I2 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == swap.matrix() ) ;

    qclab::dense::SquareMatrix< T >  mat(  1 ,  2 ,  3 ,  4 ,
                                           5 ,  6 ,  7 ,  8 ,
                                           9 , 10 , 11 , 12 ,
                                          13 , 14 , 15 , 16 ) ;

    mat2 = mat ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == mat * swap.matrix() ) ;

    mat2 = mat ;
    swap.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == swap.matrix() * mat ) ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( swap.matrix() , I1 ) ) ;

    int qnew[] = { 1 , 2 } ;
    swap.setQubits( &qnew[0] ) ;
    mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 , swap.matrix() ) ) ;
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 2 ) ;

    auto check = qclab::dense::zeros< T >( 8 ) ;
    check(0,0) = 1 ;
    check(4,1) = 1 ;
    check(2,2) = 1 ;
    check(6,3) = 1 ;
    check(1,4) = 1 ;
    check(5,5) = 1 ;
    check(3,6) = 1 ;
    check(7,7) = 1 ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == check ) ;
  }

}